

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

ssh2_userkey * ppk_load_s(BinarySource *src,char *passphrase,char **errorstr)

{
  BinarySink *bs;
  byte bVar1;
  uint uVar2;
  bool bVar3;
  ptrlen data;
  ptrlen pVar4;
  ptrlen pVar5;
  byte *pbVar6;
  ptrlen passphrase_salt;
  _Bool _Var7;
  int iVar8;
  strbuf *buf_o;
  char *pcVar9;
  ssh_keyalg *psVar10;
  char *pcVar11;
  strbuf *buf_o_00;
  size_t sVar12;
  ushort **ppuVar13;
  strbuf *buf_o_01;
  ssh2_mac *psVar14;
  ssh_key *psVar15;
  byte bVar16;
  char *__s;
  ulong uVar17;
  undefined4 uVar18;
  undefined8 unaff_R13;
  ppk_cipher *ppVar19;
  char *pcVar20;
  ssh2_macalg *psVar21;
  Argon2Flavour AVar22;
  byte *pbVar23;
  ssh2_userkey *ptr;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ptrlen passphrase_00;
  char header [40];
  ppk_save_parameters params;
  ptrlen mackey;
  ptrlen cipheriv;
  ptrlen cipherkey;
  uchar binary [32];
  char s [3];
  strbuf *local_1a0;
  strbuf *local_198;
  char local_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  char cStack_158;
  char cStack_157;
  char cStack_156;
  char cStack_155;
  char cStack_154;
  char cStack_153;
  undefined4 local_140;
  uint local_13c;
  BinarySink *local_138;
  uint local_12c;
  char *local_128;
  ppk_cipher *local_120;
  int local_114;
  ssh_keyalg *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  size_t local_e8;
  ptrlen local_d8;
  uchar *local_c8;
  size_t sStack_c0;
  ptrlen local_b8;
  ptrlen local_a8;
  byte local_98 [32];
  byte local_78;
  byte local_77;
  undefined1 local_76;
  
  buf_o = strbuf_new();
  _Var7 = read_header(src,&local_168);
  if (!_Var7) {
    pcVar20 = "no header line found in key file";
LAB_0010fd68:
    ptr = (ssh2_userkey *)0x0;
    goto LAB_0010ffce;
  }
  auVar25[0] = -(cStack_162 == 'U');
  auVar25[1] = -(cStack_161 == 's');
  auVar25[2] = -(cStack_160 == 'e');
  auVar25[3] = -(cStack_15f == 'r');
  auVar25[4] = -(cStack_15e == '-');
  auVar25[5] = -(cStack_15d == 'K');
  auVar25[6] = -(cStack_15c == 'e');
  auVar25[7] = -(cStack_15b == 'y');
  auVar25[8] = -(cStack_15a == '-');
  auVar25[9] = -(cStack_159 == 'F');
  auVar25[10] = -(cStack_158 == 'i');
  auVar25[0xb] = -(cStack_157 == 'l');
  auVar25[0xc] = -(cStack_156 == 'e');
  auVar25[0xd] = -(cStack_155 == '-');
  auVar25[0xe] = -(cStack_154 == '3');
  auVar25[0xf] = -(cStack_153 == '\0');
  auVar28[0] = -(local_168 == 'P');
  auVar28[1] = -(cStack_167 == 'u');
  auVar28[2] = -(cStack_166 == 'T');
  auVar28[3] = -(cStack_165 == 'T');
  auVar28[4] = -(cStack_164 == 'Y');
  auVar28[5] = -(cStack_163 == '-');
  auVar28[6] = -(cStack_162 == 'U');
  auVar28[7] = -(cStack_161 == 's');
  auVar28[8] = -(cStack_160 == 'e');
  auVar28[9] = -(cStack_15f == 'r');
  auVar28[10] = -(cStack_15e == '-');
  auVar28[0xb] = -(cStack_15d == 'K');
  auVar28[0xc] = -(cStack_15c == 'e');
  auVar28[0xd] = -(cStack_15b == 'y');
  auVar28[0xe] = -(cStack_15a == '-');
  auVar28[0xf] = -(cStack_159 == 'F');
  auVar28 = auVar28 & auVar25;
  bVar24 = (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff;
  if (bVar24) {
    uVar18 = 0;
    local_13c = 3;
  }
  else {
    auVar29[0] = -(cStack_162 == 'U');
    auVar29[1] = -(cStack_161 == 's');
    auVar29[2] = -(cStack_160 == 'e');
    auVar29[3] = -(cStack_15f == 'r');
    auVar29[4] = -(cStack_15e == '-');
    auVar29[5] = -(cStack_15d == 'K');
    auVar29[6] = -(cStack_15c == 'e');
    auVar29[7] = -(cStack_15b == 'y');
    auVar29[8] = -(cStack_15a == '-');
    auVar29[9] = -(cStack_159 == 'F');
    auVar29[10] = -(cStack_158 == 'i');
    auVar29[0xb] = -(cStack_157 == 'l');
    auVar29[0xc] = -(cStack_156 == 'e');
    auVar29[0xd] = -(cStack_155 == '-');
    auVar29[0xe] = -(cStack_154 == '2');
    auVar29[0xf] = -(cStack_153 == '\0');
    auVar33[0] = -(local_168 == 'P');
    auVar33[1] = -(cStack_167 == 'u');
    auVar33[2] = -(cStack_166 == 'T');
    auVar33[3] = -(cStack_165 == 'T');
    auVar33[4] = -(cStack_164 == 'Y');
    auVar33[5] = -(cStack_163 == '-');
    auVar33[6] = -(cStack_162 == 'U');
    auVar33[7] = -(cStack_161 == 's');
    auVar33[8] = -(cStack_160 == 'e');
    auVar33[9] = -(cStack_15f == 'r');
    auVar33[10] = -(cStack_15e == '-');
    auVar33[0xb] = -(cStack_15d == 'K');
    auVar33[0xc] = -(cStack_15c == 'e');
    auVar33[0xd] = -(cStack_15b == 'y');
    auVar33[0xe] = -(cStack_15a == '-');
    auVar33[0xf] = -(cStack_159 == 'F');
    auVar29 = auVar29 & auVar33;
    if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff) {
      local_13c = 2;
      uVar18 = 0;
    }
    else {
      auVar30[0] = -(cStack_162 == 'U');
      auVar30[1] = -(cStack_161 == 's');
      auVar30[2] = -(cStack_160 == 'e');
      auVar30[3] = -(cStack_15f == 'r');
      auVar30[4] = -(cStack_15e == '-');
      auVar30[5] = -(cStack_15d == 'K');
      auVar30[6] = -(cStack_15c == 'e');
      auVar30[7] = -(cStack_15b == 'y');
      auVar30[8] = -(cStack_15a == '-');
      auVar30[9] = -(cStack_159 == 'F');
      auVar30[10] = -(cStack_158 == 'i');
      auVar30[0xb] = -(cStack_157 == 'l');
      auVar30[0xc] = -(cStack_156 == 'e');
      auVar30[0xd] = -(cStack_155 == '-');
      auVar30[0xe] = -(cStack_154 == '1');
      auVar30[0xf] = -(cStack_153 == '\0');
      auVar34[0] = -(local_168 == 'P');
      auVar34[1] = -(cStack_167 == 'u');
      auVar34[2] = -(cStack_166 == 'T');
      auVar34[3] = -(cStack_165 == 'T');
      auVar34[4] = -(cStack_164 == 'Y');
      auVar34[5] = -(cStack_163 == '-');
      auVar34[6] = -(cStack_162 == 'U');
      auVar34[7] = -(cStack_161 == 's');
      auVar34[8] = -(cStack_160 == 'e');
      auVar34[9] = -(cStack_15f == 'r');
      auVar34[10] = -(cStack_15e == '-');
      auVar34[0xb] = -(cStack_15d == 'K');
      auVar34[0xc] = -(cStack_15c == 'e');
      auVar34[0xd] = -(cStack_15b == 'y');
      auVar34[0xe] = -(cStack_15a == '-');
      auVar34[0xf] = -(cStack_159 == 'F');
      auVar30 = auVar30 & auVar34;
      if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) != 0xffff) {
        auVar26[0] = -(local_168 == 'P');
        auVar26[1] = -(cStack_167 == 'u');
        auVar26[2] = -(cStack_166 == 'T');
        auVar26[3] = -(cStack_165 == 'T');
        auVar26[4] = -(cStack_164 == 'Y');
        auVar26[5] = -(cStack_163 == '-');
        auVar26[6] = -(cStack_162 == 'U');
        auVar26[7] = -(cStack_161 == 's');
        auVar26[8] = -(cStack_160 == 'e');
        auVar26[9] = -(cStack_15f == 'r');
        auVar26[10] = -(cStack_15e == '-');
        auVar26[0xb] = -(cStack_15d == 'K');
        auVar26[0xc] = -(cStack_15c == 'e');
        auVar26[0xd] = -(cStack_15b == 'y');
        auVar26[0xe] = -(cStack_15a == '-');
        auVar26[0xf] = -(cStack_159 == 'F');
        auVar31[0] = -(cStack_158 == 'i');
        auVar31[1] = -(cStack_157 == 'l');
        auVar31[2] = -(cStack_156 == 'e');
        auVar31[3] = -(cStack_155 == '-');
        auVar31[4] = 0xff;
        auVar31[5] = 0xff;
        auVar31[6] = 0xff;
        auVar31[7] = 0xff;
        auVar31[8] = 0xff;
        auVar31[9] = 0xff;
        auVar31[10] = 0xff;
        auVar31[0xb] = 0xff;
        auVar31[0xc] = 0xff;
        auVar31[0xd] = 0xff;
        auVar31[0xe] = 0xff;
        auVar31[0xf] = 0xff;
        auVar31 = auVar31 & auVar26;
        pcVar20 = "not a PuTTY SSH-2 private key";
        if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff) {
          pcVar20 = "PuTTY key format too new";
        }
        goto LAB_0010fd68;
      }
      old_keyfile_warning();
      local_13c = 1;
      uVar18 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    }
  }
  pcVar9 = read_body(src);
  pcVar20 = "file format error";
  if (pcVar9 != (char *)0x0) {
    local_140 = uVar18;
    psVar10 = find_pubkey_alg(pcVar9);
    safefree(pcVar9);
    local_110 = psVar10;
    if ((((psVar10 != (ssh_keyalg *)0x0) && (_Var7 = read_header(src,&local_168), _Var7)) &&
        (CONCAT17(cStack_15e,
                  CONCAT16(cStack_15f,
                           CONCAT15(cStack_160,
                                    CONCAT14(cStack_161,
                                             CONCAT13(cStack_162,
                                                      CONCAT12(cStack_163,
                                                               CONCAT11(cStack_164,cStack_165)))))))
         == 0x6e6f6974707972 &&
         CONCAT17(cStack_161,
                  CONCAT16(cStack_162,
                           CONCAT15(cStack_163,
                                    CONCAT14(cStack_164,
                                             CONCAT13(cStack_165,
                                                      CONCAT12(cStack_166,
                                                               CONCAT11(cStack_167,local_168)))))))
         == 0x6974707972636e45)) && (pcVar9 = read_body(src), pcVar9 != (char *)0x0)) {
      local_114 = strcmp(pcVar9,"aes256-cbc");
      local_128 = pcVar9;
      if (local_114 == 0) {
        ppVar19 = &ppk_cipher_aes256_cbc;
LAB_0010fea8:
        _Var7 = read_header(src,&local_168);
        if (((_Var7) &&
            (CONCAT17(cStack_161,
                      CONCAT16(cStack_162,
                               CONCAT15(cStack_163,
                                        CONCAT14(cStack_164,
                                                 CONCAT13(cStack_165,
                                                          CONCAT12(cStack_166,
                                                                   CONCAT11(cStack_167,local_168))))
                                       ))) == 0x746e656d6d6f43)) &&
           (pcVar9 = read_body(src), pcVar9 != (char *)0x0)) {
          local_f8 = (undefined1  [16])0x0;
          local_108 = (undefined1  [16])0x0;
          local_e8 = 0;
          _Var7 = read_header(src,&local_168);
          pcVar20 = "file format error";
          if (((_Var7) &&
              (CONCAT17(cStack_15c,
                        CONCAT16(cStack_15d,
                                 CONCAT15(cStack_15e,
                                          CONCAT14(cStack_15f,
                                                   CONCAT13(cStack_160,
                                                            CONCAT12(cStack_161,
                                                                     CONCAT11(cStack_162,cStack_163)
                                                                    )))))) == 0x73656e694c2d63 &&
               CONCAT17(cStack_161,
                        CONCAT16(cStack_162,
                                 CONCAT15(cStack_163,
                                          CONCAT14(cStack_164,
                                                   CONCAT13(cStack_165,
                                                            CONCAT12(cStack_166,
                                                                     CONCAT11(cStack_167,local_168))
                                                           ))))) == 0x4c2d63696c627550)) &&
             (pcVar11 = read_body(src), pcVar11 != (char *)0x0)) {
            iVar8 = userkey_parse_line_counter(pcVar11);
            safefree(pcVar11);
            if (iVar8 < 0) goto LAB_0010ff4a;
            local_120 = ppVar19;
            buf_o_00 = strbuf_new();
            _Var7 = read_blob(src,iVar8,buf_o_00->binarysink_);
            if (!_Var7) {
              pcVar11 = (char *)0x0;
              ptr = (ssh2_userkey *)0x0;
              local_1a0 = (strbuf *)0x0;
              local_198 = (strbuf *)0x0;
              goto LAB_0010ff65;
            }
            local_12c = (uint)!bVar24;
            if ((local_12c == 0) && (local_120->keylen != 0)) {
              _Var7 = read_header(src,&local_168);
              if ((_Var7) &&
                 (CONCAT17(cStack_15a,
                           CONCAT16(cStack_15b,
                                    CONCAT15(cStack_15c,
                                             CONCAT14(cStack_15d,
                                                      CONCAT13(cStack_15e,
                                                               CONCAT12(cStack_15f,
                                                                        CONCAT11(cStack_160,
                                                                                 cStack_161)))))))
                  == 0x6e6f6974617669 &&
                  CONCAT17(cStack_161,
                           CONCAT16(cStack_162,
                                    CONCAT15(cStack_163,
                                             CONCAT14(cStack_164,
                                                      CONCAT13(cStack_165,
                                                               CONCAT12(cStack_166,
                                                                        CONCAT11(cStack_167,
                                                                                 local_168))))))) ==
                  0x697265442d79654b)) {
                pbVar23 = (byte *)read_body(src);
                AVar22 = Argon2d;
                if (pbVar23 == (byte *)0x0) {
                  ptr = (ssh2_userkey *)0x0;
                  local_1a0 = (strbuf *)0x0;
                  local_198 = (strbuf *)0x0;
                  pcVar11 = (char *)0x0;
                  goto LAB_0010ff65;
                }
                iVar8 = strcmp((char *)pbVar23,"Argon2d");
                if (iVar8 != 0) {
                  iVar8 = strcmp((char *)pbVar23,"Argon2i");
                  if (iVar8 == 0) {
                    AVar22 = Argon2i;
                  }
                  else {
                    iVar8 = strcmp((char *)pbVar23,"Argon2id");
                    if (iVar8 != 0) {
LAB_0011035e:
                      safefree(pbVar23);
                      goto LAB_001102e0;
                    }
                    AVar22 = Argon2id;
                  }
                }
                local_108._4_4_ = AVar22;
                safefree(pbVar23);
                _Var7 = read_header(src,&local_168);
                if (((_Var7) &&
                    (CONCAT17(cStack_15b,
                              CONCAT16(cStack_15c,
                                       CONCAT15(cStack_15d,
                                                CONCAT14(cStack_15e,
                                                         CONCAT13(cStack_15f,
                                                                  CONCAT12(cStack_160,
                                                                           CONCAT11(cStack_161,
                                                                                    cStack_162))))))
                             ) == 0x79726f6d654d2d &&
                     CONCAT17(cStack_161,
                              CONCAT16(cStack_162,
                                       CONCAT15(cStack_163,
                                                CONCAT14(cStack_164,
                                                         CONCAT13(cStack_165,
                                                                  CONCAT12(cStack_166,
                                                                           CONCAT11(cStack_167,
                                                                                    local_168)))))))
                     == 0x4d2d326e6f677241)) && (pcVar11 = read_body(src), pcVar11 != (char *)0x0))
                {
                  _Var7 = str_to_uint32_t(pcVar11,(uint32_t *)(local_108 + 8));
                  safefree(pcVar11);
                  if (((_Var7) && (_Var7 = read_header(src,&local_168), _Var7)) &&
                     ((CONCAT17(cStack_15b,
                                CONCAT16(cStack_15c,
                                         CONCAT15(cStack_15d,
                                                  CONCAT14(cStack_15e,
                                                           CONCAT13(cStack_15f,
                                                                    CONCAT12(cStack_160,
                                                                             CONCAT11(cStack_161,
                                                                                      cStack_162))))
                                                 ))) == 0x7365737361502d &&
                       CONCAT17(cStack_161,
                                CONCAT16(cStack_162,
                                         CONCAT15(cStack_163,
                                                  CONCAT14(cStack_164,
                                                           CONCAT13(cStack_165,
                                                                    CONCAT12(cStack_166,
                                                                             CONCAT11(cStack_167,
                                                                                      local_168)))))
                                        )) == 0x502d326e6f677241 &&
                      (pcVar11 = read_body(src), pcVar11 != (char *)0x0)))) {
                    _Var7 = str_to_uint32_t(pcVar11,(uint32_t *)local_f8);
                    safefree(pcVar11);
                    if ((_Var7) && (_Var7 = read_header(src,&local_168), _Var7)) {
                      auVar32[0] = -(cStack_165 == 'o');
                      auVar32[1] = -(cStack_164 == 'n');
                      auVar32[2] = -(cStack_163 == '2');
                      auVar32[3] = -(cStack_162 == '-');
                      auVar32[4] = -(cStack_161 == 'P');
                      auVar32[5] = -(cStack_160 == 'a');
                      auVar32[6] = -(cStack_15f == 'r');
                      auVar32[7] = -(cStack_15e == 'a');
                      auVar32[8] = -(cStack_15d == 'l');
                      auVar32[9] = -(cStack_15c == 'l');
                      auVar32[10] = -(cStack_15b == 'e');
                      auVar32[0xb] = -(cStack_15a == 'l');
                      auVar32[0xc] = -(cStack_159 == 'i');
                      auVar32[0xd] = -(cStack_158 == 's');
                      auVar32[0xe] = -(cStack_157 == 'm');
                      auVar32[0xf] = -(cStack_156 == '\0');
                      auVar27[0] = -(local_168 == 'A');
                      auVar27[1] = -(cStack_167 == 'r');
                      auVar27[2] = -(cStack_166 == 'g');
                      auVar27[3] = -(cStack_165 == 'o');
                      auVar27[4] = -(cStack_164 == 'n');
                      auVar27[5] = -(cStack_163 == '2');
                      auVar27[6] = -(cStack_162 == '-');
                      auVar27[7] = -(cStack_161 == 'P');
                      auVar27[8] = -(cStack_160 == 'a');
                      auVar27[9] = -(cStack_15f == 'r');
                      auVar27[10] = -(cStack_15e == 'a');
                      auVar27[0xb] = -(cStack_15d == 'l');
                      auVar27[0xc] = -(cStack_15c == 'l');
                      auVar27[0xd] = -(cStack_15b == 'e');
                      auVar27[0xe] = -(cStack_15a == 'l');
                      auVar27[0xf] = -(cStack_159 == 'i');
                      auVar27 = auVar27 & auVar32;
                      if (((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff) &&
                         (pcVar11 = read_body(src), pcVar11 != (char *)0x0)) {
                        _Var7 = str_to_uint32_t(pcVar11,(uint32_t *)(local_f8 + 4));
                        safefree(pcVar11);
                        if ((((_Var7) && (_Var7 = read_header(src,&local_168), _Var7)) &&
                            (CONCAT13(cStack_15d,
                                      CONCAT12(cStack_15e,CONCAT11(cStack_15f,cStack_160))) ==
                             0x746c61 &&
                             CONCAT17(cStack_161,
                                      CONCAT16(cStack_162,
                                               CONCAT15(cStack_163,
                                                        CONCAT14(cStack_164,
                                                                 CONCAT13(cStack_165,
                                                                          CONCAT12(cStack_166,
                                                                                   CONCAT11(
                                                  cStack_167,local_168))))))) == 0x532d326e6f677241)
                            ) && (pbVar23 = (byte *)read_body(src), pbVar23 != (byte *)0x0)) {
                          bVar16 = *pbVar23;
                          if (bVar16 != 0) {
                            ppuVar13 = __ctype_b_loc();
                            local_138 = buf_o->binarysink_;
                            pbVar6 = pbVar23;
                            do {
                              if ((*(byte *)((long)*ppuVar13 + (ulong)bVar16 * 2 + 1) & 0x10) == 0)
                              goto LAB_0011035e;
                              bVar1 = pbVar6[1];
                              if (((ulong)bVar1 == 0) ||
                                 ((*(byte *)((long)*ppuVar13 + (ulong)bVar1 * 2 + 1) & 0x10) == 0))
                              goto LAB_0011035e;
                              local_76 = 0;
                              local_78 = bVar16;
                              local_77 = bVar1;
                              uVar17 = strtoul((char *)&local_78,(char **)0x0,0x10);
                              BinarySink_put_byte(local_138,(uchar)uVar17);
                              bVar16 = pbVar6[2];
                              pbVar6 = pbVar6 + 2;
                            } while (bVar16 != 0);
                          }
                          safefree(pbVar23);
                          goto LAB_0011006d;
                        }
                      }
                    }
                  }
                }
              }
LAB_001102e0:
              local_1a0 = (strbuf *)0x0;
LAB_001102ef:
              ptr = (ssh2_userkey *)0x0;
              pcVar11 = (char *)0x0;
              local_198 = (strbuf *)0x0;
              goto LAB_0010ff65;
            }
LAB_0011006d:
            _Var7 = read_header(src,&local_168);
            if (((!_Var7) ||
                (CONCAT17(cStack_15b,
                          CONCAT16(cStack_15c,
                                   CONCAT15(cStack_15d,
                                            CONCAT14(cStack_15e,
                                                     CONCAT13(cStack_15f,
                                                              CONCAT12(cStack_160,
                                                                       CONCAT11(cStack_161,
                                                                                cStack_162))))))) !=
                 0x73656e694c2d65 ||
                 CONCAT17(cStack_161,
                          CONCAT16(cStack_162,
                                   CONCAT15(cStack_163,
                                            CONCAT14(cStack_164,
                                                     CONCAT13(cStack_165,
                                                              CONCAT12(cStack_166,
                                                                       CONCAT11(cStack_167,local_168
                                                                               ))))))) !=
                 0x2d65746176697250)) || (pcVar11 = read_body(src), pcVar11 == (char *)0x0))
            goto LAB_001102e0;
            iVar8 = userkey_parse_line_counter(pcVar11);
            safefree(pcVar11);
            if (iVar8 < 0) goto LAB_001102e0;
            local_1a0 = strbuf_new_nm();
            _Var7 = read_blob(src,iVar8,local_1a0->binarysink_);
            if ((!_Var7) || (_Var7 = read_header(src,&local_168), !_Var7)) goto LAB_001102ef;
            local_138 = (BinarySink *)((ulong)local_138 & 0xffffffff00000000);
            bVar24 = CONCAT13(cStack_15d,CONCAT12(cStack_15e,CONCAT11(cStack_15f,cStack_160))) !=
                     0x43414d;
            bVar3 = CONCAT17(cStack_161,
                             CONCAT16(cStack_162,
                                      CONCAT15(cStack_163,
                                               CONCAT14(cStack_164,
                                                        CONCAT13(cStack_165,
                                                                 CONCAT12(cStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168)))))))
                    != 0x2d65746176697250;
            if (((bVar24 || bVar3) &&
                ((char)local_140 != '\x01' ||
                 (CONCAT17(cStack_15c,
                           CONCAT16(cStack_15d,
                                    CONCAT15(cStack_15e,
                                             CONCAT14(cStack_15f,
                                                      CONCAT13(cStack_160,
                                                               CONCAT12(cStack_161,
                                                                        CONCAT11(cStack_162,
                                                                                 cStack_163)))))))
                  != 0x687361482d6574 ||
                 CONCAT17(cStack_161,
                          CONCAT16(cStack_162,
                                   CONCAT15(cStack_163,
                                            CONCAT14(cStack_164,
                                                     CONCAT13(cStack_165,
                                                              CONCAT12(cStack_166,
                                                                       CONCAT11(cStack_167,local_168
                                                                               ))))))) !=
                 0x2d65746176697250))) || (pcVar11 = read_body(src), pcVar11 == (char *)0x0))
            goto LAB_001102ef;
            local_198 = strbuf_new();
            __s = "";
            if (passphrase != (char *)0x0) {
              __s = passphrase;
            }
            sVar12 = strlen(__s);
            ppVar19 = local_120;
            local_c8 = buf_o->u;
            sStack_c0 = buf_o->len;
            passphrase_salt.ptr = buf_o->u;
            passphrase_salt.len = buf_o->len;
            passphrase_00.len = sVar12;
            passphrase_00.ptr = __s;
            ssh2_ppk_derive_keys
                      (local_13c,local_120,passphrase_00,local_198,&local_a8,&local_b8,&local_d8,
                       passphrase_salt,(ppk_save_parameters *)local_108);
            ptr = (ssh2_userkey *)0x0;
            if (local_1a0->len % ppVar19->blocklen != 0) goto LAB_0010ff65;
            if (local_114 == 0) {
              aes256_decrypt_pubkey(local_a8.ptr,local_b8.ptr,local_1a0->u,(int)local_1a0->len);
            }
            if (local_12c == 0) {
              psVar21 = &ssh_hmac_sha256;
            }
            else {
              psVar21 = &ssh_hmac_sha1;
            }
            local_138 = (BinarySink *)
                        CONCAT44(local_138._4_4_,
                                 CONCAT31((int3)((ulong)local_138 >> 8),bVar24 || bVar3));
            buf_o_01 = local_1a0;
            if ((char)local_140 == '\0') {
              buf_o_01 = strbuf_new_nm();
              bs = buf_o_01->binarysink_;
              BinarySink_put_stringz(bs,local_110->ssh_id);
              BinarySink_put_stringz(bs,local_128);
              BinarySink_put_stringz(bs,pcVar9);
              BinarySink_put_string(bs,buf_o_00->s,buf_o_00->len);
              BinarySink_put_string(bs,local_1a0->s,local_1a0->len);
            }
            if ((int)local_138 == 0) {
              psVar14 = (*psVar21->new)(psVar21,(ssh_cipher *)0x0);
              (*psVar14->vt->setkey)(psVar14,local_d8);
              (*psVar14->vt->start)(psVar14);
              BinarySink_put_data(psVar14->binarysink_,buf_o_01->s,buf_o_01->len);
              (*psVar14->vt->genresult)(psVar14,local_98);
              (*psVar14->vt->free)(psVar14);
            }
            else {
              data.ptr = buf_o_01->u;
              data.len = buf_o_01->len;
              hash_simple(&ssh_sha1,data,local_98);
            }
            if ((char)local_140 == '\0') {
              strbuf_free(buf_o_01);
            }
            if (local_12c == 0) {
              psVar21 = &ssh_hmac_sha256;
            }
            else {
              psVar21 = &ssh_hmac_sha1;
            }
            uVar2 = psVar21->len;
            if (0 < (int)uVar2) {
              pbVar23 = &local_78;
              uVar17 = 0;
              do {
                sprintf((char *)pbVar23,"%02x",(ulong)local_98[uVar17]);
                uVar17 = uVar17 + 1;
                pbVar23 = pbVar23 + 2;
              } while (uVar2 != uVar17);
            }
            iVar8 = strcmp(pcVar11,(char *)&local_78);
            if (iVar8 != 0) {
              bVar24 = local_120->keylen == 0;
              pcVar20 = "wrong passphrase";
              if (bVar24) {
                pcVar20 = "MAC failed";
              }
              ptr = &ssh2_wrong_passphrase;
              if (bVar24) {
                ptr = (ssh2_userkey *)0x0;
              }
              goto LAB_0010ff65;
            }
            pcVar20 = (char *)0x0;
            ptr = (ssh2_userkey *)safemalloc(1,0x10,0);
            ptr->comment = pcVar9;
            pVar4.ptr = buf_o_00->u;
            pVar4.len = buf_o_00->len;
            pVar5.ptr = local_1a0->u;
            pVar5.len = local_1a0->len;
            psVar15 = (*local_110->new_priv)(local_110,pVar4,pVar5);
            ptr->key = psVar15;
            if (psVar15 == (ssh_key *)0x0) {
              safefree(ptr);
              pcVar20 = "createkey failed";
              ptr = (ssh2_userkey *)0x0;
            }
            safefree(local_128);
LAB_0010ff84:
            safefree(pcVar11);
          }
          else {
LAB_0010ff4a:
            pcVar11 = (char *)0x0;
            ptr = (ssh2_userkey *)0x0;
            buf_o_00 = (strbuf *)0x0;
            local_1a0 = (strbuf *)0x0;
            local_198 = (strbuf *)0x0;
LAB_0010ff65:
            safefree(pcVar9);
            safefree(local_128);
            if (pcVar11 != (char *)0x0) goto LAB_0010ff84;
          }
          if (buf_o_00 != (strbuf *)0x0) {
            strbuf_free(buf_o_00);
          }
          if (local_1a0 != (strbuf *)0x0) {
            strbuf_free(local_1a0);
          }
          if (local_198 != (strbuf *)0x0) {
            strbuf_free(local_198);
          }
          goto LAB_0010ffce;
        }
      }
      else {
        iVar8 = strcmp(pcVar9,"none");
        if (iVar8 == 0) {
          ppVar19 = &ppk_cipher_none;
          goto LAB_0010fea8;
        }
      }
      safefree(local_128);
    }
  }
  ptr = (ssh2_userkey *)0x0;
LAB_0010ffce:
  strbuf_free(buf_o);
  if (errorstr != (char **)0x0) {
    *errorstr = pcVar20;
  }
  return ptr;
}

Assistant:

ssh2_userkey *ppk_load_s(BinarySource *src, const char *passphrase,
                         const char **errorstr)
{
    char header[40], *b, *encryption, *comment, *mac;
    const ssh_keyalg *alg;
    ssh2_userkey *ret;
    strbuf *public_blob, *private_blob, *cipher_mac_keys_blob;
    strbuf *passphrase_salt = strbuf_new();
    ptrlen cipherkey, cipheriv, mackey;
    const struct ppk_cipher *ciphertype;
    int i;
    bool is_mac;
    unsigned fmt_version;
    const char *error = NULL;
    ppk_save_parameters params;

    ret = NULL;                        /* return NULL for most errors */
    encryption = comment = mac = NULL;
    public_blob = private_blob = cipher_mac_keys_blob = NULL;

    /* Read the first header line which contains the key type. */
    if (!read_header(src, header)) {
        error = "no header line found in key file";
        goto error;
    }
    if (0 == strcmp(header, "PuTTY-User-Key-File-3")) {
        fmt_version = 3;
    } else if (0 == strcmp(header, "PuTTY-User-Key-File-2")) {
        fmt_version = 2;
    } else if (0 == strcmp(header, "PuTTY-User-Key-File-1")) {
        /* this is an old key file; warn and then continue */
        old_keyfile_warning();
        fmt_version = 1;
    } else if (0 == strncmp(header, "PuTTY-User-Key-File-", 20)) {
        /* this is a key file FROM THE FUTURE; refuse it, but with a
         * more specific error message than the generic one below */
        error = "PuTTY key format too new";
        goto error;
    } else {
        error = "not a PuTTY SSH-2 private key";
        goto error;
    }
    error = "file format error";
    if ((b = read_body(src)) == NULL)
        goto error;
    /* Select key algorithm structure. */
    alg = find_pubkey_alg(b);
    if (!alg) {
        sfree(b);
        goto error;
    }
    sfree(b);

    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption"))
        goto error;
    if ((encryption = read_body(src)) == NULL)
        goto error;
    if (!strcmp(encryption, "aes256-cbc")) {
        ciphertype = &ppk_cipher_aes256_cbc;
    } else if (!strcmp(encryption, "none")) {
        ciphertype = &ppk_cipher_none;
    } else {
        goto error;
    }

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment"))
        goto error;
    if ((comment = read_body(src)) == NULL)
        goto error;

    memset(&params, 0, sizeof(params)); /* in particular, sets
                                         * passes_auto=false */

    /* Read the Public-Lines header line and the public blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Public-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    public_blob = strbuf_new();
    if (!read_blob(src, i, BinarySink_UPCAST(public_blob)))
        goto error;

    if (fmt_version >= 3 && ciphertype->keylen != 0) {
        /* Read Argon2 key derivation parameters. */
        if (!read_header(src, header) || 0 != strcmp(header, "Key-Derivation"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!strcmp(b, "Argon2d")) {
            params.argon2_flavour = Argon2d;
        } else if (!strcmp(b, "Argon2i")) {
            params.argon2_flavour = Argon2i;
        } else if (!strcmp(b, "Argon2id")) {
            params.argon2_flavour = Argon2id;
        } else {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Memory"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_mem)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Passes"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_passes)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) ||
            0 != strcmp(header, "Argon2-Parallelism"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_parallelism)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Salt"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        for (size_t i = 0; b[i]; i += 2) {
            if (isxdigit((unsigned char)b[i]) && b[i+1] &&
                isxdigit((unsigned char)b[i+1])) {
                char s[3];
                s[0] = b[i];
                s[1] = b[i+1];
                s[2] = '\0';
                put_byte(passphrase_salt, strtoul(s, NULL, 16));
            } else {
                sfree(b);
                goto error;
            }
        }
        sfree(b);
    }

    /* Read the Private-Lines header line and the Private blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Private-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    private_blob = strbuf_new_nm();
    if (!read_blob(src, i, BinarySink_UPCAST(private_blob)))
        goto error;

    /* Read the Private-MAC or Private-Hash header line. */
    if (!read_header(src, header))
        goto error;
    if (0 == strcmp(header, "Private-MAC")) {
        if ((mac = read_body(src)) == NULL)
            goto error;
        is_mac = true;
    } else if (0 == strcmp(header, "Private-Hash") && fmt_version == 1) {
        if ((mac = read_body(src)) == NULL)
            goto error;
        is_mac = false;
    } else
        goto error;

    cipher_mac_keys_blob = strbuf_new();
    ssh2_ppk_derive_keys(fmt_version, ciphertype,
                         ptrlen_from_asciz(passphrase ? passphrase : ""),
                         cipher_mac_keys_blob, &cipherkey, &cipheriv, &mackey,
                         ptrlen_from_strbuf(passphrase_salt), &params);

    /*
     * Decrypt the private blob.
     */
    if (private_blob->len % ciphertype->blocklen)
        goto error;
    if (ciphertype == &ppk_cipher_aes256_cbc) {
        aes256_decrypt_pubkey(cipherkey.ptr, cipheriv.ptr,
                              private_blob->u, private_blob->len);
    }

    /*
     * Verify the MAC.
     */
    {
        unsigned char binary[32];
        char realmac[sizeof(binary) * 2 + 1];
        strbuf *macdata;
        bool free_macdata;

        const ssh2_macalg *mac_alg =
            fmt_version <= 2 ? &ssh_hmac_sha1 : &ssh_hmac_sha256;

        if (fmt_version == 1) {
            /* MAC (or hash) only covers the private blob. */
            macdata = private_blob;
            free_macdata = false;
        } else {
            macdata = strbuf_new_nm();
            put_stringz(macdata, alg->ssh_id);
            put_stringz(macdata, encryption);
            put_stringz(macdata, comment);
            put_string(macdata, public_blob->s,
                       public_blob->len);
            put_string(macdata, private_blob->s,
                       private_blob->len);
            free_macdata = true;
        }

        if (is_mac) {
            ssh2_mac *mac;

            mac = ssh2_mac_new(mac_alg, NULL);
            ssh2_mac_setkey(mac, mackey);
            ssh2_mac_start(mac);
            put_data(mac, macdata->s, macdata->len);
            ssh2_mac_genresult(mac, binary);
            ssh2_mac_free(mac);
        } else {
            hash_simple(&ssh_sha1, ptrlen_from_strbuf(macdata), binary);
        }

        if (free_macdata)
            strbuf_free(macdata);

        for (i = 0; i < mac_alg->len; i++)
            sprintf(realmac + 2 * i, "%02x", binary[i]);

        if (strcmp(mac, realmac)) {
            /* An incorrect MAC is an unconditional Error if the key is
             * unencrypted. Otherwise, it means Wrong Passphrase. */
            if (ciphertype->keylen != 0) {
                error = "wrong passphrase";
                ret = SSH2_WRONG_PASSPHRASE;
            } else {
                error = "MAC failed";
                ret = NULL;
            }
            goto error;
        }
    }

    /*
     * Create and return the key.
     */
    ret = snew(ssh2_userkey);
    ret->comment = comment;
    comment = NULL;
    ret->key = ssh_key_new_priv(
        alg, ptrlen_from_strbuf(public_blob),
        ptrlen_from_strbuf(private_blob));
    if (!ret->key) {
        sfree(ret);
        ret = NULL;
        error = "createkey failed";
        goto error;
    }
    error = NULL;

    /*
     * Error processing.
     */
  error:
    if (comment)
        sfree(comment);
    if (encryption)
        sfree(encryption);
    if (mac)
        sfree(mac);
    if (public_blob)
        strbuf_free(public_blob);
    if (private_blob)
        strbuf_free(private_blob);
    if (cipher_mac_keys_blob)
        strbuf_free(cipher_mac_keys_blob);
    strbuf_free(passphrase_salt);
    if (errorstr)
        *errorstr = error;
    return ret;
}